

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceMappingImpl.hpp
# Opt level: O1

void __thiscall
Diligent::ResourceMappingImpl::ResMappingHashKey::ResMappingHashKey
          (ResMappingHashKey *this,Char *Str,bool bMakeCopy,Uint32 ArrInd)

{
  size_t Seed;
  Uint32 local_2c;
  ulong local_28;
  size_t local_20;
  
  local_2c = ArrInd;
  HashMapStringKey::HashMapStringKey(&this->super_HashMapStringKey,Str,bMakeCopy);
  this->ArrayIndex = local_2c;
  local_28 = (this->super_HashMapStringKey).Ownership_Hash & 0x7fffffffffffffff;
  local_20 = 0;
  HashCombine<unsigned_long,unsigned_int>(&local_20,&local_28,&local_2c);
  (this->super_HashMapStringKey).Ownership_Hash =
       (this->super_HashMapStringKey).Ownership_Hash & 0x8000000000000000 |
       local_20 & 0x7fffffffffffffff;
  return;
}

Assistant:

ResMappingHashKey(const Char* Str, bool bMakeCopy, Uint32 ArrInd) noexcept :
            HashMapStringKey{Str, bMakeCopy},
            ArrayIndex{ArrInd}
        {
            Ownership_Hash = (ComputeHash(GetHash(), ArrInd) & HashMask) | (Ownership_Hash & StrOwnershipMask);
        }